

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O2

int AF_A_PhoenixPuff(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  DObject *this_00;
  char *__assertion;
  FName local_60;
  FName local_5c;
  DVector3 local_58;
  DAngle angle;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052db4e;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_0052d9b1:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052db4e;
        }
      }
      if (numparam == 1) goto LAB_0052da31;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0052db3e;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0052db4e;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0052db3e;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0052da31:
        FName::FName(&local_5c,"PhoenixPuff");
        local_58.X = *(double *)&this_00[1].ObjectFlags;
        local_58.Y = (double)this_00[2]._vptr_DObject;
        local_58.Z = (double)this_00[2].Class;
        pAVar3 = Spawn(&local_5c,&local_58,ALLOW_REPLACE);
        angle.Degrees = (double)this_00[3].GCNext + 90.0;
        TAngle<double>::ToVector((TAngle<double> *)&local_58,1.3);
        (pAVar3->Vel).Z = 0.0;
        (pAVar3->Vel).X = local_58.X;
        (pAVar3->Vel).Y = local_58.Y;
        FName::FName(&local_60,"PhoenixPuff");
        local_58.X = *(double *)&this_00[1].ObjectFlags;
        local_58.Y = (double)this_00[2]._vptr_DObject;
        local_58.Z = (double)this_00[2].Class;
        pAVar3 = Spawn(&local_60,&local_58,ALLOW_REPLACE);
        angle.Degrees = (double)this_00[3].GCNext + -90.0;
        TAngle<double>::ToVector((TAngle<double> *)&local_58,1.3);
        (pAVar3->Vel).Z = 0.0;
        (pAVar3->Vel).X = local_58.X;
        (pAVar3->Vel).Y = local_58.Y;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0052db4e;
    }
    if (this_00 == (DObject *)0x0) goto LAB_0052d9b1;
  }
LAB_0052db3e:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0052db4e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PhoenixPuff)
{
	PARAM_ACTION_PROLOGUE;

	AActor *puff;
	DAngle angle;

	//[RH] Heretic never sets the target for seeking
	//P_SeekerMissile (self, 5, 10);
	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw + 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);

	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw - 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);
	return 0;
}